

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O3

bool __thiscall ON_PlaneSurface::Trim(ON_PlaneSurface *this,int dir,ON_Interval *domain)

{
  double dVar1;
  bool bVar2;
  double *pdVar3;
  ON_Interval *this_00;
  long lVar4;
  ON_Interval *rhs;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  ON_Interval trim_extents;
  ON_Interval trim_domain;
  ON_Interval current_domain;
  ON_Interval local_78;
  double local_60;
  ON_Interval local_58;
  ON_Interval local_48;
  ON_Interval local_38;
  
  if (1 < (uint)dir) {
    return false;
  }
  (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])();
  local_48.m_t[0] = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  local_48.m_t[1] = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  pdVar3 = ON_Interval::operator[](&local_48,0);
  if ((*pdVar3 == -1.23432101234321e+308) && (!NAN(*pdVar3))) {
    pdVar3 = ON_Interval::operator[](&local_48,1);
    if ((*pdVar3 == -1.23432101234321e+308) && (!NAN(*pdVar3))) {
      local_48.m_t[0] = domain->m_t[0];
      local_48.m_t[1] = domain->m_t[1];
    }
  }
  ON_Interval::ON_Interval(&local_58);
  lVar4 = (ulong)(uint)dir * 0x10;
  local_78.m_t[0] = *(double *)(&this->field_0xb0 + lVar4);
  local_78.m_t[1] = *(double *)((long)(&this->field_0xb0 + lVar4) + 8);
  (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
            (this,(ulong)(uint)dir);
  ON_Interval::Intersection(&local_58,domain,&local_38);
  bVar2 = ON_Interval::IsIncreasing(&local_58);
  if (bVar2) {
    rhs = (ON_Interval *)(&this->field_0xb0 + lVar4);
    this_00 = (ON_Interval *)(&this->field_0x90 + lVar4);
    bVar2 = ON_Interval::operator==(this_00,rhs);
    if (bVar2) {
      local_78.m_t[0] = local_58.m_t[0];
      local_78.m_t[1] = local_58.m_t[1];
    }
    else {
      pdVar3 = ON_Interval::operator[](&local_58,0);
      dVar1 = ON_Interval::NormalizedParameterAt(this_00,*pdVar3);
      local_60 = ON_Interval::ParameterAt(rhs,dVar1);
      pdVar3 = ON_Interval::operator[](&local_58,1);
      dVar1 = ON_Interval::NormalizedParameterAt(this_00,*pdVar3);
      dVar1 = ON_Interval::ParameterAt(rhs,dVar1);
      ON_Interval::Set(&local_78,local_60,dVar1);
    }
    bVar2 = ON_Interval::IsIncreasing(&local_78);
    if (bVar2) {
      rhs->m_t[0] = local_78.m_t[0];
      *(double *)(&this->field_0xb8 + lVar4) = local_78.m_t[1];
      this_00->m_t[0] = local_58.m_t[0];
      *(double *)(&this->field_0x98 + lVar4) = local_58.m_t[1];
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_PlaneSurface::Trim(
       int dir,
       const ON_Interval& domain
       )
{
  if ( dir < 0 || dir > 1 )
    return false;
  ON_Interval current_domain = Domain(dir);
  if ( current_domain[0] == ON_UNSET_VALUE && current_domain[1] == ON_UNSET_VALUE )
    current_domain = domain;
  ON_Interval trim_domain, trim_extents = m_extents[dir];
  trim_domain.Intersection(domain, Domain(dir) );
  if ( !trim_domain.IsIncreasing() )
    return false;
  if ( m_domain[dir] == m_extents[dir] )
    trim_extents = trim_domain;
  else
  {
    double x0 = m_extents[dir].ParameterAt( m_domain[dir].NormalizedParameterAt( trim_domain[0] ) );
    double x1 = m_extents[dir].ParameterAt( m_domain[dir].NormalizedParameterAt( trim_domain[1] ) );
    trim_extents.Set(x0,x1);
  }
  if ( !trim_extents.IsIncreasing() )
    return false;
  m_extents[dir] = trim_extents;
  m_domain[dir] = trim_domain;
  return true;
}